

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_get_factors.c
# Opt level: O3

lu_int basiclu_get_factors(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux
                          ,lu_int *Wi,double *Wx,lu_int *rowperm,lu_int *colperm,lu_int *Lcolptr,
                          lu_int *Lrowidx,double *Lvalue_,lu_int *Ucolptr,lu_int *Urowidx,
                          double *Uvalue_)

{
  int *piVar1;
  lu_int lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  undefined1 local_2e8 [84];
  uint local_294;
  int local_284;
  long local_148;
  long local_138;
  long local_130;
  long local_120;
  void *local_110;
  void *local_100;
  void *local_d8;
  long local_d0;
  long local_c0;
  long local_a8;
  long local_98;
  long local_70;
  long local_40;
  
  lVar2 = lu_load(local_2e8,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar2 != 0) {
    return lVar2;
  }
  if (local_284 == 0) {
    uVar4 = (ulong)local_294;
    lVar10 = (long)(int)local_294;
    if (rowperm != (lu_int *)0x0) {
      memcpy(rowperm,local_100,lVar10 * 4);
    }
    if (colperm != (lu_int *)0x0) {
      memcpy(colperm,local_110,lVar10 * 4);
    }
    if (Lvalue_ != (double *)0x0 && (Lrowidx != (lu_int *)0x0 && Lcolptr != (lu_int *)0x0)) {
      if ((int)local_294 < 1) {
        Lcolptr[lVar10] = 0;
      }
      else {
        uVar6 = 0;
        iVar9 = 0;
        do {
          Lcolptr[uVar6] = iVar9;
          Lrowidx[iVar9] = (lu_int)uVar6;
          Lvalue_[iVar9] = 1.0;
          *(int *)((long)local_d8 + (long)*(int *)(local_98 + uVar6 * 4) * 4) = iVar9 + 1;
          lVar7 = uVar6 * 4;
          lVar3 = uVar6 * 4;
          uVar6 = uVar6 + 1;
          iVar9 = iVar9 + 1 + *(int *)(local_70 + 4 + lVar3) + ~*(uint *)(local_70 + lVar7);
        } while (uVar4 != uVar6);
        Lcolptr[lVar10] = iVar9;
        if (0 < (int)local_294) {
          uVar6 = 0;
          do {
            lVar7 = (long)*(int *)(local_a8 + uVar6 * 4);
            uVar8 = *(uint *)(local_148 + lVar7 * 4);
            if (-1 < (int)uVar8) {
              lVar7 = lVar7 << 2;
              do {
                iVar9 = *(int *)((long)local_d8 + (ulong)uVar8 * 4);
                *(int *)((long)local_d8 + (ulong)uVar8 * 4) = iVar9 + 1;
                Lrowidx[iVar9] = (lu_int)uVar6;
                Lvalue_[iVar9] = *(double *)(local_130 + lVar7 * 2);
                uVar8 = *(uint *)(local_148 + 4 + lVar7);
                lVar7 = lVar7 + 4;
              } while (-1 < (int)uVar8);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar4);
        }
      }
    }
    if (Uvalue_ != (double *)0x0 && (Urowidx != (lu_int *)0x0 && Ucolptr != (lu_int *)0x0)) {
      memset(local_d8,0,lVar10 * 4);
      if (0 < (int)local_294) {
        lVar7 = 0;
        do {
          iVar9 = *(int *)(local_d0 + lVar7 * 4);
          lVar3 = (long)iVar9;
          if (iVar9 < *(int *)(local_c0 + lVar7 * 4)) {
            do {
              piVar1 = (int *)((long)local_d8 + (long)*(int *)(local_138 + lVar3 * 4) * 4);
              *piVar1 = *piVar1 + 1;
              lVar3 = lVar3 + 1;
            } while (lVar3 < *(int *)(local_c0 + lVar7 * 4));
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar10);
        if (0 < (int)local_294) {
          lVar7 = 0;
          iVar9 = 0;
          do {
            lVar3 = (long)*(int *)((long)local_110 + lVar7 * 4);
            Ucolptr[lVar7] = iVar9;
            lVar5 = (long)*(int *)((long)local_d8 + lVar3 * 4) + (long)iVar9;
            *(int *)((long)local_d8 + lVar3 * 4) = iVar9;
            Urowidx[lVar5] = (lu_int)lVar7;
            iVar9 = (int)lVar5 + 1;
            Uvalue_[lVar5] = *(double *)(local_40 + lVar3 * 8);
            lVar7 = lVar7 + 1;
          } while (lVar10 != lVar7);
          Ucolptr[lVar10] = iVar9;
          if ((int)local_294 < 1) {
            return 0;
          }
          uVar6 = 0;
          do {
            lVar10 = (long)*(int *)((long)local_110 + uVar6 * 4);
            iVar9 = *(int *)(local_d0 + lVar10 * 4);
            lVar7 = (long)iVar9;
            if (iVar9 < *(int *)(local_c0 + lVar10 * 4)) {
              do {
                lVar3 = (long)*(int *)(local_138 + lVar7 * 4);
                iVar9 = *(int *)((long)local_d8 + lVar3 * 4);
                *(int *)((long)local_d8 + lVar3 * 4) = iVar9 + 1;
                Urowidx[iVar9] = (lu_int)uVar6;
                Uvalue_[iVar9] = *(double *)(local_120 + lVar7 * 8);
                lVar7 = lVar7 + 1;
              } while (lVar7 < *(int *)(local_c0 + lVar10 * 4));
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar4);
          return 0;
        }
      }
      Ucolptr[lVar10] = 0;
    }
    return 0;
  }
  lVar2 = lu_save(local_2e8,istore,xstore,-2);
  return lVar2;
}

Assistant:

lu_int basiclu_get_factors
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int rowperm[],
    lu_int colperm[],
    lu_int Lcolptr[],
    lu_int Lrowidx[],
    double Lvalue_[],
    lu_int Ucolptr[],
    lu_int Urowidx[],
    double Uvalue_[]
)
{
    struct lu this;
    lu_int m, status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;
    if (this.nupdate != 0)
    {
        status = BASICLU_ERROR_invalid_call;
        return lu_save(&this, istore, xstore, status);
    }
    m = this.m;

    if (rowperm)
        memcpy(rowperm, this.pivotrow, m*sizeof(lu_int));
    if (colperm)
        memcpy(colperm, this.pivotcol, m*sizeof(lu_int));

    if (Lcolptr && Lrowidx && Lvalue_)
    {
        const lu_int *Lbegin_p  = this.Lbegin_p;
        const lu_int *Ltbegin_p = this.Ltbegin_p;
        const lu_int *Lindex    = this.Lindex;
        const double *Lvalue    = this.Lvalue;
        const lu_int *p         = this.p;
        lu_int *colptr          = this.iwork1; /* size m workspace */
        lu_int i, k, put, pos;

        /*
         * L[:,k] will hold the elimination factors from the k-th pivot step.
         * First set the column pointers and store the unit diagonal elements
         * at the front of each column. Then scatter each row of L' into the
         * columnwise L so that the row indices become sorted.
         */
        put = 0;
        for (k = 0; k < m; k++)
        {
            Lcolptr[k] = put;
            Lrowidx[put] = k;
            Lvalue_[put++] = 1.0;
            colptr[p[k]] = put; /* next free position in column */
            put += Lbegin_p[k+1] - Lbegin_p[k] - 1;
            /* subtract 1 because internal storage uses (-1) terminators */
        }
        Lcolptr[m] = put;
        assert(put == this.Lnz+m);

        for (k = 0; k < m; k++)
        {
            for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                put = colptr[i]++;
                Lrowidx[put] = k;
                Lvalue_[put] = Lvalue[pos];
            }
        }

        #ifndef NDEBUG
        for (k = 0; k < m; k++)
        {
            assert(colptr[p[k]] == Lcolptr[k+1]);
        }
        #endif
    }

    if (Ucolptr && Urowidx && Uvalue_)
    {
        const lu_int *Wbegin    = this.Wbegin;
        const lu_int *Wend      = this.Wend;
        const lu_int *Windex    = this.Windex;
        const double *Wvalue    = this.Wvalue;
        const double *col_pivot = this.col_pivot;
        const lu_int *pivotcol  = this.pivotcol;
        lu_int *colptr          = this.iwork1; /* size m workspace */
        lu_int j, k, put, pos;

        /*
         * U[:,k] will hold the column of B from the k-th pivot step.
         * First set the column pointers and store the pivot element at the end
         * of each column. Then scatter each row of U' into the columnwise U so
         * that the row indices become sorted.
         */
        memset(colptr, 0, m*sizeof(lu_int)); /* column counts */
        for (j = 0; j < m; j++)
        {
            for (pos = Wbegin[j]; pos < Wend[j]; pos++)
                colptr[Windex[pos]]++;
        }
        put = 0;
        for (k = 0; k < m; k++) /* set column pointers */
        {
            j = pivotcol[k];
            Ucolptr[k] = put;
            put += colptr[j];
            colptr[j] = Ucolptr[k]; /* next free position in column */
            Urowidx[put] = k;
            Uvalue_[put++] = col_pivot[j];
        }
        Ucolptr[m] = put;
        assert(put == this.Unz+m);
        for (k = 0; k < m; k++) /* scatter row k */
        {
            j = pivotcol[k];
            for (pos = Wbegin[j]; pos < Wend[j]; pos++)
            {
                put = colptr[Windex[pos]]++;
                Urowidx[put] = k;
                Uvalue_[put] = Wvalue[pos];
            }
        }

        #ifndef NDEBUG
        for (k = 0; k < m; k++) assert(colptr[pivotcol[k]] == Ucolptr[k+1]-1);
        for (k = 0; k < m; k++) assert(Urowidx[Ucolptr[k+1]-1] == k);
        #endif
    }

    return BASICLU_OK;
}